

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O3

void test_bson_utf8_non_shortest(void)

{
  char *__s;
  char cVar1;
  size_t sVar2;
  uchar *suite;
  char **ppcVar3;
  
  ppcVar3 = test_bson_utf8_non_shortest::tests;
  suite = (uchar *)0x0;
  do {
    __s = *ppcVar3;
    sVar2 = strlen(__s);
    cVar1 = bson_utf8_validate(__s,sVar2,0);
    if (cVar1 != '\0') {
      test_bson_utf8_non_shortest_cold_2();
      goto LAB_001377a9;
    }
    suite = (uchar *)((long)&((TestSuite *)suite)->prgname + 1);
    ppcVar3 = ppcVar3 + 1;
  } while ((TestSuite *)suite != (TestSuite *)0x5);
  suite = test_bson_utf8_validate::test2;
  cVar1 = bson_utf8_validate(test_bson_utf8_validate::test2,2,1);
  if (cVar1 != '\0') {
    return;
  }
LAB_001377a9:
  test_bson_utf8_non_shortest_cold_1();
  TestSuite_Add((TestSuite *)suite,"/bson/value/basic",test_value_basic);
  TestSuite_Add((TestSuite *)suite,"/bson/value/decimal128",test_value_decimal128);
  return;
}

Assistant:

static void
test_bson_utf8_non_shortest (void)
{
   static const char *tests[] = {
      "\xE0\x80\x80",     /* Non-shortest form representation of U+0000 */
      "\xF0\x80\x80\x80", /* Non-shortest form representation of U+0000 */

      "\xE0\x83\xBF",     /* Non-shortest form representation of U+00FF */
      "\xF0\x80\x83\xBF", /* Non-shortest form representation of U+00FF */

      "\xF0\x80\xA3\x80", /* Non-shortest form representation of U+08C0 */

      NULL};
   static const char *valid_tests[] = {
      "\xC0\x80", /* Non-shortest form representation of U+0000.
                   * This is how \0 should be encoded. Special casing
                   * to allow for use in things like strlen(). */

      NULL};
   int i;

   for (i = 0; tests[i]; i++) {
      if (bson_utf8_validate (tests[i], strlen (tests[i]), false)) {
         fprintf (stderr, "non-shortest form failure, test %d\n", i);
         BSON_ASSERT (false);
      }
   }

   for (i = 0; valid_tests[i]; i++) {
      if (!bson_utf8_validate (valid_tests[i], strlen (valid_tests[i]), true)) {
         fprintf (stderr, "non-shortest form failure, valid_tests %d\n", i);
         BSON_ASSERT (false);
      }
   }
}